

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O3

String * __thiscall
nigel::IMC_Generator::operatorToString_abi_cxx11_
          (String *__return_storage_ptr__,IMC_Generator *this,shared_ptr<nigel::IM_Operator> *op)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  int iVar7;
  long *plVar8;
  size_type *psVar9;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  string local_80;
  undefined1 local_60 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _func_int **local_40;
  element_type *local_38;
  
  switch(((op->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type) {
  case constant:
    IM_Operator::as<nigel::IM_Constant>((IM_Operator *)local_60);
    helper::int_to_hex<unsigned_char>(&local_80,*(u8 *)(local_60._0_8_ + 0x1c));
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x170de8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar9) {
      lVar3 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0014aa99;
    break;
  case variable:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_60);
    uVar1 = *(uint *)(local_60._0_8_ + 0x20);
    cVar5 = '\x01';
    if (9 < uVar1) {
      uVar10 = uVar1;
      cVar6 = '\x04';
      do {
        cVar5 = cVar6;
        if (uVar10 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0014a7fe;
        }
        if (uVar10 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0014a7fe;
        }
        if (uVar10 < 10000) goto LAB_0014a7fe;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar6 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_0014a7fe:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_80._M_dataplus._M_p,(uint)local_80._M_string_length,uVar1);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x170e81);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar9) {
      lVar3 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0014aa99;
    break;
  case sfr:
    IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_80);
    cVar5 = local_80._M_dataplus._M_p[0x1c];
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length));
    }
    if (cVar5 == -0x20) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar12 = "A";
      pcVar11 = "";
    }
    else {
      IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_80);
      cVar5 = local_80._M_dataplus._M_p[0x1c];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length));
      }
      if (cVar5 == -0x10) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar12 = "B";
        pcVar11 = "";
      }
      else {
        IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_80);
        cVar5 = local_80._M_dataplus._M_p[0x1c];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length) !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length));
        }
        if (cVar5 == -0x7f) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar12 = "SP";
          pcVar11 = "";
        }
        else {
          IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_80);
          cVar5 = local_80._M_dataplus._M_p[0x1c];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length));
          }
          if (cVar5 == '\a') {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar12 = "BR";
            pcVar11 = "";
          }
          else {
            IM_Operator::as<nigel::IM_SFR>((IM_Operator *)&local_80);
            cVar5 = local_80._M_dataplus._M_p[0x1c];
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length) !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length));
            }
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if (cVar5 == '\x06') {
              pcVar12 = "SW";
              pcVar11 = "";
            }
            else {
              pcVar12 = "-!-UNKNOWN_SFR-!-";
              pcVar11 = "";
            }
          }
        }
      }
    }
    goto LAB_0014aab3;
  case block:
    IM_Operator::as<nigel::IM_Block>((IM_Operator *)&local_80);
    iVar7 = std::__cxx11::string::compare(local_80._M_dataplus._M_p + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length));
    }
    if (iVar7 != 0) {
      IM_Operator::as<nigel::IM_Block>((IM_Operator *)&local_80);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(local_80._M_dataplus._M_p + 0x20),
                 *(long *)(local_80._M_dataplus._M_p + 0x28) +
                 *(long *)(local_80._M_dataplus._M_p + 0x20));
      local_60._8_8_ = CONCAT44(local_80._M_string_length._4_4_,(uint)local_80._M_string_length);
      goto LAB_0014aa99;
    }
    IM_Operator::as<nigel::IM_Block>((IM_Operator *)local_60);
    cVar5 = *(char *)(local_60._0_8_ + 0x40);
    if (cVar5 == '\0') {
      IM_Operator::as<nigel::IM_Block>((IM_Operator *)(local_60 + 0x10));
      pcVar11 = "end";
      if (*(char *)((long)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._16_8_ + 0x40)
                           )->_vptr__Sp_counted_base + 1) != '\0') {
        pcVar11 = "finish";
      }
    }
    else {
      pcVar11 = "begin";
    }
    IM_Operator::as<nigel::IM_Block>((IM_Operator *)&local_40);
    uVar1 = *(uint *)((long)local_40 + 0x1c);
    cVar6 = '\x01';
    if (9 < uVar1) {
      uVar10 = uVar1;
      cVar4 = '\x04';
      do {
        cVar6 = cVar4;
        if (uVar10 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_0014a9d7;
        }
        if (uVar10 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_0014a9d7;
        }
        if (uVar10 < 10000) goto LAB_0014a9d7;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar4 = cVar6 + '\x04';
      } while (bVar2);
      cVar6 = cVar6 + '\x01';
    }
LAB_0014a9d7:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_80._M_dataplus._M_p,(uint)local_80._M_string_length,uVar1);
    strlen(pcVar11);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar11);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar9) {
      lVar3 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (local_38 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
    if (cVar5 != '\0') goto LAB_0014aa99;
    goto LAB_0014aa85;
  case condition:
    IM_Operator::as<nigel::IM_Condition>((IM_Operator *)local_60);
    pcVar11 = "false";
    if (*(char *)(local_60._0_8_ + 0x20) != '\0') {
      pcVar11 = "true";
    }
    IM_Operator::as<nigel::IM_Condition>((IM_Operator *)(local_60 + 0x10));
    uVar1 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_60._16_8_ + 0x10))->
            _M_weak_count;
    cVar5 = '\x01';
    if (9 < uVar1) {
      uVar10 = uVar1;
      cVar6 = '\x04';
      do {
        cVar5 = cVar6;
        if (uVar10 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0014a8a2;
        }
        if (uVar10 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0014a8a2;
        }
        if (uVar10 < 10000) goto LAB_0014a8a2;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar6 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_0014a8a2:
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_80._M_dataplus._M_p,(uint)local_80._M_string_length,uVar1);
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)pcVar11);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar8 + 2);
    if ((size_type *)*plVar8 == psVar9) {
      lVar3 = plVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar8[1];
    *plVar8 = (long)psVar9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
LAB_0014aa85:
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    goto LAB_0014aa99;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar12 = "-!-UNKNOWN-!-";
    pcVar11 = "";
LAB_0014aab3:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar12,pcVar11);
    return __return_storage_ptr__;
  }
  operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
LAB_0014aa99:
  if ((element_type *)local_60._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

String IMC_Generator::operatorToString( std::shared_ptr<IM_Operator> op )
	{
		if( op->type == IM_Operator::Type::constant ) return "#" + int_to_hex( op->as<IM_Constant>()->data );
		else if( op->type == IM_Operator::Type::variable ) return "v" + to_string( op->as<IM_Variable>()->id );
		else if( op->type == IM_Operator::Type::sfr )
		{
			if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::A ) ) return "A";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::B ) ) return "B";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::SP ) ) return "SP";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::BR ) ) return "BR";
			else if( op->as<IM_SFR>()->address == static_cast< u8 >( IM_SFR::SFR::SW ) ) return "SW";
			else return "-!-UNKNOWN_SFR-!-";
		}
		else if( op->type == IM_Operator::Type::block )
		{
			if( op->as<IM_Block>()->symbol != "" ) return op->as<IM_Block>()->symbol;
			else return ( op->as<IM_Block>()->begin ? "begin" : op->as<IM_Block>()->finish ? "finish" : "end" ) + to_string( op->as<IM_Block>()->blockID );
		}
		else if( op->type == IM_Operator::Type::condition )
			return ( op->as<IM_Condition>()->isTrue ? "true" : "false" ) + to_string( op->as<IM_Condition>()->conditionID );
		else return "-!-UNKNOWN-!-";
	}